

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vga_ManAddClausesOne(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  Vta_Obj_t *pVVar2;
  ulong uVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Vta_Obj_t *pVVar6;
  Vta_Obj_t *pVVar7;
  Vta_Obj_t *pVVar8;
  uint uVar9;
  uint *end;
  uint uVar10;
  long lVar11;
  sat_solver2 *s;
  int iVar12;
  uint Entry;
  ulong uVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  sat_solver2 *local_40;
  ulong local_38;
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
LAB_0061b979:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar14 = p->pGia->pObjs + (uint)iObj;
  pVVar7 = Vga_ManFindOrAdd(p,iObj,iFrame);
  pVVar2 = p->pObjs;
  if ((pVVar7 <= pVVar2) || (pVVar2 + p->nObjs <= pVVar7)) goto LAB_0061b95a;
  if ((pVVar7->iObj != iObj) || (pVVar7->iFrame != iFrame)) {
    __assert_fail("pThis->iObj == iObj && pThis->iFrame == iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x4ec,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
  }
  if ((*(uint *)&pVVar7->field_0xc >> 0x1e & 1) != 0) {
    return;
  }
  uVar13 = (ulong)((long)pVVar7 - (long)pVVar2) >> 4;
  *(uint *)&pVVar7->field_0xc = *(uint *)&pVVar7->field_0xc | 0x40000000;
  Entry = (uint)uVar13;
  Vec_IntPush(p->vAddedNew,Entry);
  uVar3 = *(ulong *)pGVar14;
  uVar10 = (uint)uVar3;
  pGVar4 = p->pGia;
  if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
    pGVar5 = pGVar4->pObjs;
    if ((pGVar5 <= pGVar14) && (pGVar14 < pGVar5 + pGVar4->nObjs)) {
      pVVar7 = Vga_ManFindOrAdd(p,(int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * -0x55555555 -
                                  (uVar10 & 0x1fffffff),iFrame);
      pVVar2 = p->pObjs;
      if ((pVVar2 < pVVar7) && (pVVar7 < pVVar2 + p->nObjs)) {
        pGVar5 = p->pGia->pObjs;
        local_38 = uVar13;
        if ((pGVar14 < pGVar5) || (pGVar5 + p->pGia->nObjs <= pGVar14)) goto LAB_0061b9b7;
        pVVar8 = Vga_ManFindOrAdd(p,(int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * -0x55555555
                                    - (*(uint *)&pGVar14->field_0x4 & 0x1fffffff),iFrame);
        pVVar6 = p->pObjs;
        if ((pVVar6 < pVVar8) && (pVVar8 < pVVar6 + p->nObjs)) {
          local_40 = p->pSat;
          uVar3 = *(ulong *)pGVar14;
          Entry = (uint)local_38;
          local_44 = Entry * 2;
          uVar10 = Entry * 2 + 1;
          uVar15 = (uint)((ulong)((long)pVVar7 - (long)pVVar2) >> 3) & 0xfffffffe |
                   (uint)(uVar3 >> 0x1d) & 1;
          local_50 = uVar10;
          local_4c = uVar15;
          sat_solver2_addclause(local_40,(lit *)&local_50,(lit *)&local_48,Entry);
          s = local_40;
          uVar9 = (uint)((ulong)((long)pVVar8 - (long)pVVar6) >> 3) & 0xfffffffe |
                  (uint)(uVar3 >> 0x3d) & 1;
          local_50 = uVar10;
          local_4c = uVar9;
          sat_solver2_addclause(local_40,(lit *)&local_50,(lit *)&local_48,Entry);
          local_50 = local_44;
          local_4c = uVar15 ^ 1;
          local_48 = uVar9 ^ 1;
          end = &local_44;
          goto LAB_0061b763;
        }
      }
LAB_0061b95a:
      __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x69,"int Vta_ObjId(Vta_Man_t *, Vta_Obj_t *)");
    }
LAB_0061b9b7:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((uVar10 & 0x9fffffff) == 0x9fffffff) {
    uVar9 = (uint)(uVar3 >> 0x20);
    iVar12 = pGVar4->vCis->nSize - pGVar4->nRegs;
    if (iVar12 <= (int)(uVar9 & 0x1fffffff)) {
      if (iFrame == 0) {
        if (p->pPars->fUseTermVars == 0) {
          sat_solver2_add_const(p->pSat,Entry,Entry,uVar10,iVar12);
          return;
        }
        pVVar7 = Vga_ManFindOrAdd(p,iObj,-1);
        pVVar2 = p->pObjs;
        if ((pVVar7 <= pVVar2) || (pVVar2 + p->nObjs <= pVVar7)) goto LAB_0061b95a;
        if ((int)Entry < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0x166,
                        "int sat_solver2_add_constraint(sat_solver2 *, int, int, int, int, int)");
        }
        s = p->pSat;
        uVar10 = Entry * 2 + 1;
        end = &local_48;
        uVar9 = (uint)((ulong)((long)pVVar7 - (long)pVVar2) >> 3);
        local_4c = uVar9 & 0xfffffffe;
        local_50 = uVar10;
        sat_solver2_addclause(s,(lit *)&local_50,(lit *)end,Entry);
        local_4c = uVar9 | 1;
        local_50 = uVar10;
      }
      else {
        uVar9 = uVar9 & 0x1fffffff;
        iVar12 = pGVar4->vCis->nSize;
        if ((int)uVar9 < iVar12 - pGVar4->nRegs) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar1 = pGVar4->vCos->nSize;
        uVar9 = (iVar1 - iVar12) + uVar9;
        if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar12 = pGVar4->vCos->pArray[uVar9];
        lVar11 = (long)iVar12;
        if ((lVar11 < 0) || (pGVar4->nObjs <= iVar12)) goto LAB_0061b979;
        pGVar14 = pGVar4->pObjs;
        pVVar7 = Vga_ManFindOrAdd(p,iVar12 - (*(uint *)(pGVar14 + lVar11) & 0x1fffffff),iFrame + -1)
        ;
        pVVar2 = p->pObjs;
        if ((pVVar7 <= pVVar2) || (pVVar2 + p->nObjs <= pVVar7)) goto LAB_0061b95a;
        uVar10 = (uint)((ulong)((long)pVVar7 - (long)pVVar2) >> 4);
        if ((int)(uVar10 | Entry) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)")
          ;
        }
        s = p->pSat;
        local_50 = Entry * 2;
        end = &local_48;
        uVar10 = ((uint)(*(ulong *)(pGVar14 + lVar11) >> 0x1d) & 1) + uVar10 * 2;
        local_4c = uVar10 ^ 1;
        sat_solver2_addclause(s,(lit *)&local_50,(lit *)end,Entry);
        local_50 = Entry * 2 + 1;
        local_4c = uVar10;
      }
      goto LAB_0061b763;
    }
  }
  if ((~uVar3 & 0x1fffffff1fffffff) != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x513,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
  }
  if ((int)Entry < 0) {
    __assert_fail("iVar >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                  ,0x10b,"int sat_solver2_add_const(sat_solver2 *, int, int, int, int)");
  }
  s = p->pSat;
  end = &local_4c;
  local_50 = Entry * 2 + 1;
LAB_0061b763:
  sat_solver2_addclause(s,(lit *)&local_50,(lit *)end,Entry);
  return;
}

Assistant:

void Vga_ManAddClausesOne( Vta_Man_t * p, int iObj, int iFrame )
{ 
    Vta_Obj_t * pThis0, * pThis1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
    Vta_Obj_t * pThis = Vga_ManFindOrAdd( p, iObj, iFrame );
    int iThis0, iMainVar = Vta_ObjId(p, pThis);
    assert( pThis->iObj == iObj && pThis->iFrame == iFrame );
    if ( pThis->fAdded )
        return;
    pThis->fAdded = 1;
    Vec_IntPush( p->vAddedNew, iMainVar );
    if ( Gia_ObjIsAnd(pObj) )
    {
        pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame );
        iThis0 = Vta_ObjId(p, pThis0);
        pThis1 = Vga_ManFindOrAdd( p, Gia_ObjFaninId1p(p->pGia, pObj), iFrame );
        sat_solver2_add_and( p->pSat, iMainVar, iThis0, Vta_ObjId(p, pThis1), 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0, iMainVar );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( iFrame == 0 )
        {
            if ( p->pPars->fUseTermVars )
            {
                pThis0 = Vga_ManFindOrAdd( p, iObj, -1 );
                sat_solver2_add_constraint( p->pSat, iMainVar, Vta_ObjId(p, pThis0), 1, 0, iMainVar );
            }
            else
            {
                sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
            }
        }
        else
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame-1 );
            sat_solver2_add_buffer( p->pSat, iMainVar, Vta_ObjId(p, pThis0), Gia_ObjFaninC0(pObj), 0, iMainVar );  
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
    }
    else //if ( !Gia_ObjIsPi(p->pGia, pObj) )
        assert( 0 );
}